

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O0

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_entry
          (BinBinaryReader *this,Hash *entryKeyHash,Embed *entry)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  size_t in_RCX;
  FNV1a *__nbytes;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  char *start_6;
  char *start_5;
  char *start_4;
  char *start_3;
  reference pvStack_60;
  Type type;
  FNV1a *name;
  size_t i;
  char *start_2;
  char *start_1;
  size_t position;
  char *start;
  uint16_t count;
  Embed *pEStack_28;
  uint32_t entryLength;
  Embed *entry_local;
  Hash *entryKeyHash_local;
  BinBinaryReader *this_local;
  
  start._4_4_ = 0;
  start._2_2_ = 0;
  position = (size_t)(this->reader).cur_;
  pEStack_28 = entry;
  entry_local = (Embed *)entryKeyHash;
  entryKeyHash_local = (Hash *)this;
  bVar2 = BinaryReader::read<unsigned_int>(&this->reader,(uint *)((long)&start + 4));
  if (bVar2) {
    start_1 = (char *)BinaryReader::position(&this->reader);
    start_2 = (this->reader).cur_;
    uVar3 = BinaryReader::read(&this->reader,(int)entry_local,__buf,in_RCX);
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = fail_msg(this,"reader.read(entryKeyHash.value)",start_2);
    }
    else {
      i = (size_t)(this->reader).cur_;
      bVar2 = BinaryReader::read<unsigned_short>(&this->reader,(unsigned_short *)((long)&start + 2))
      ;
      if (bVar2) {
        for (name = (FNV1a *)0x0; __nbytes = (FNV1a *)(ulong)start._2_2_, name != __nbytes;
            name = (FNV1a *)((long)&name->hash_ + 1)) {
          pvStack_60 = std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::emplace_back<>
                                 (&pEStack_28->items);
          start_3._7_1_ = NONE;
          pcVar1 = (this->reader).cur_;
          uVar3 = BinaryReader::read(&this->reader,(int)pvStack_60,__buf_00,(size_t)__nbytes);
          if ((uVar3 & 1) == 0) {
            bVar2 = fail_msg(this,"reader.read(name)",pcVar1);
            return bVar2;
          }
          pcVar1 = (this->reader).cur_;
          uVar3 = BinaryReader::read(&this->reader,(int)&start_3 + 7,__buf_01,(size_t)__nbytes);
          if ((uVar3 & 1) == 0) {
            bVar2 = fail_msg(this,"reader.read(type)",pcVar1);
            return bVar2;
          }
          pcVar1 = (this->reader).cur_;
          bVar2 = read_value_of(this,&pvStack_60->value,start_3._7_1_);
          if (!bVar2) {
            bVar2 = fail_msg(this,"read_value_of(item, type)",pcVar1);
            return bVar2;
          }
        }
        pcVar1 = (this->reader).cur_;
        pcVar4 = (char *)BinaryReader::position(&this->reader);
        if (pcVar4 == start_1 + start._4_4_) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = fail_msg(this,"reader.position() == position + entryLength",pcVar1);
        }
      }
      else {
        this_local._7_1_ = fail_msg(this,"reader.read(count)",(char *)i);
      }
    }
  }
  else {
    this_local._7_1_ = fail_msg(this,"reader.read(entryLength)",(char *)position);
  }
  return this_local._7_1_;
}

Assistant:

bool read_entry(Hash& entryKeyHash, Embed& entry) noexcept {
            uint32_t entryLength = 0;
            uint16_t count = 0;
            bin_assert(reader.read(entryLength));
            size_t position = reader.position();
            bin_assert(reader.read(entryKeyHash.value));
            bin_assert(reader.read(count));
            for (size_t i = 0; i != count; i++) {
                auto& [name, item] = entry.items.emplace_back();
                Type type = {};
                bin_assert(reader.read(name));
                bin_assert(reader.read(type));
                bin_assert(read_value_of(item, type));
            }
            bin_assert(reader.position() == position + entryLength);
            return true;
        }